

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::fromString(APInt *this,uint numbits,StringRef str,uint8_t radix)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint64_t *puVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  uint uStack_60;
  uint local_40;
  
  uVar8 = str.Length;
  pcVar9 = str.Data;
  if (uVar8 == 0) {
    __assert_fail("!str.empty() && \"Invalid string length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7ad,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((0x24 < radix) || ((0x1000010504U >> ((ulong)radix & 0x3f) & 1) == 0)) {
    __assert_fail("(radix == 10 || radix == 8 || radix == 16 || radix == 2 || radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7b0,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  cVar2 = *pcVar9;
  if ((cVar2 == '+') || (uVar11 = uVar8, pcVar12 = pcVar9, cVar2 == '-')) {
    uVar11 = uVar8 - 1;
    if (uVar11 == 0) {
      __assert_fail("slen && \"String is only a sign, needs a value.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x7b8,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
    }
    pcVar12 = pcVar9 + 1;
  }
  uVar10 = (ulong)numbits;
  if (radix == '\x02' && uVar10 < uVar11) {
    __assert_fail("(slen <= numbits || radix != 2) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7ba,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  lVar1 = uVar11 - 1;
  if ((radix == '\b') && (uVar10 < (ulong)(lVar1 * 3))) {
    __assert_fail("((slen-1)*3 <= numbits || radix != 8) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7bb,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if (radix == '\x10' && (uVar10 <= (ulong)(lVar1 * 4) && lVar1 * 4 - uVar10 != 0)) {
    __assert_fail("((slen-1)*4 <= numbits || radix != 16) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7bc,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((radix == '\n') && (uVar10 < (ulong)(lVar1 * 0x40) / 0x16)) {
    __assert_fail("(((slen-1)*64)/22 <= numbits || radix != 10) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7be,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((ulong)this->BitWidth < 0x41) {
    puVar6 = (uint64_t *)0x0;
  }
  else {
    puVar6 = getClearedMemory((uint)((ulong)this->BitWidth + 0x3f >> 6));
  }
  (this->U).VAL = (uint64_t)puVar6;
  uVar3 = (uint)radix;
  if (radix == '\b') {
    uStack_60 = 3;
  }
  else if (uVar3 == 0x10) {
    uStack_60 = 4;
  }
  else {
    uStack_60 = (uint)(radix == '\x02');
  }
  do {
    if (pcVar12 == pcVar9 + uVar8) {
      if (cVar2 != '-') {
        return;
      }
      negate(this);
      return;
    }
    iVar4 = (int)*pcVar12;
    local_40 = (uint)radix;
    if ((radix == '\x10') || (uVar7 = local_40, uVar3 == 0x24)) {
      uVar5 = iVar4 - 0x30;
      if (9 < uVar5) {
        if (radix - 0xb < iVar4 - 0x41U) {
          uVar7 = 10;
          if (radix - 0xb < iVar4 - 0x61U) goto LAB_0013ac6a;
          uVar5 = iVar4 - 0x57;
        }
        else {
          uVar5 = iVar4 - 0x37;
        }
      }
    }
    else {
LAB_0013ac6a:
      uVar5 = iVar4 - 0x30;
      if (uVar7 <= uVar5) {
        uVar5 = 0xffffffff;
      }
    }
    if (local_40 <= uVar5) {
      __assert_fail("digit < radix && \"Invalid character in digit string\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x7cc,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
    }
    if (1 < uVar11) {
      if (uStack_60 == 0) {
        operator*=(this,(ulong)uVar3);
      }
      else {
        operator<<=(this,uStack_60);
      }
    }
    operator+=(this,(ulong)uVar5);
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

void APInt::fromString(unsigned numbits, StringRef str, uint8_t radix) {
  // Check our assumptions here
  assert(!str.empty() && "Invalid string length");
  assert((radix == 10 || radix == 8 || radix == 16 || radix == 2 ||
          radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  StringRef::iterator p = str.begin();
  size_t slen = str.size();
  bool isNeg = *p == '-';
  if (*p == '-' || *p == '+') {
    p++;
    slen--;
    assert(slen && "String is only a sign, needs a value.");
  }
  assert((slen <= numbits || radix != 2) && "Insufficient bit width");
  assert(((slen-1)*3 <= numbits || radix != 8) && "Insufficient bit width");
  assert(((slen-1)*4 <= numbits || radix != 16) && "Insufficient bit width");
  assert((((slen-1)*64)/22 <= numbits || radix != 10) &&
         "Insufficient bit width");

  // Allocate memory if needed
  if (isSingleWord())
    U.VAL = 0;
  else
    U.pVal = getClearedMemory(getNumWords());

  // Figure out if we can shift instead of multiply
  unsigned shift = (radix == 16 ? 4 : radix == 8 ? 3 : radix == 2 ? 1 : 0);

  // Enter digit traversal loop
  for (StringRef::iterator e = str.end(); p != e; ++p) {
    unsigned digit = getDigit(*p, radix);
    assert(digit < radix && "Invalid character in digit string");

    // Shift or multiply the value by the radix
    if (slen > 1) {
      if (shift)
        *this <<= shift;
      else
        *this *= radix;
    }

    // Add in the digit we just interpreted
    *this += digit;
  }
  // If its negative, put it in two's complement form
  if (isNeg)
    this->negate();
}